

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  Mat *pMVar10;
  size_t sVar11;
  int _h;
  int _c;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Option *opt_00;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  Mat *pMVar21;
  Mat *pMVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int x;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  float *pfVar30;
  void *pvVar31;
  bool bVar32;
  undefined1 local_170 [56];
  int local_138;
  size_t local_130;
  long local_128;
  BinaryOp *local_120;
  Mat local_118;
  undefined1 local_d0 [44];
  int iStack_a4;
  undefined8 uStack_a0;
  int local_98;
  size_t local_90;
  size_t local_88;
  float *local_80;
  float *local_78;
  int local_6c;
  ulong local_68;
  void *local_60;
  long local_58;
  ulong local_50;
  long local_48;
  float *local_40;
  long local_38;
  
  pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d0._40_4_ = pMVar10->dims;
  local_118.dims = pMVar10[1].dims;
  iVar13 = local_118.dims;
  if (local_118.dims < (int)local_d0._40_4_) {
    iVar13 = local_d0._40_4_;
  }
  local_d0._0_8_ = pMVar10->data;
  local_d0._8_8_ = pMVar10->refcount;
  local_d0._16_8_ = pMVar10->elemsize;
  local_d0._24_4_ = pMVar10->elempack;
  local_d0._32_8_ = pMVar10->allocator;
  uVar2 = pMVar10->h;
  uVar3 = pMVar10->d;
  uStack_a0._4_4_ = uVar3;
  uStack_a0._0_4_ = uVar2;
  iStack_a4 = pMVar10->w;
  local_98 = pMVar10->c;
  local_90 = pMVar10->cstep;
  if ((int *)local_d0._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + 1;
    UNLOCK();
    local_118.dims = pMVar10[1].dims;
  }
  local_118.data = pMVar10[1].data;
  local_118.refcount = pMVar10[1].refcount;
  local_118.elemsize = pMVar10[1].elemsize;
  local_118.elempack = pMVar10[1].elempack;
  local_118.allocator = pMVar10[1].allocator;
  uVar4 = pMVar10[1].w;
  uVar5 = pMVar10[1].h;
  uVar6 = pMVar10[1].d;
  uVar7 = pMVar10[1].c;
  local_118.cstep = pMVar10[1].cstep;
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + 1;
    UNLOCK();
  }
  pMVar22 = pMVar10 + 1;
  local_120 = this;
  local_118.w = uVar4;
  local_118.h = uVar5;
  local_118.d = uVar6;
  local_118.c = uVar7;
  if (pMVar10->dims < iVar13) {
    if (iVar13 == 2) {
      iVar12 = pMVar10->w;
      if (iVar12 == pMVar10[1].h) {
        Mat::reshape((Mat *)local_170,pMVar10,1,iVar12,(Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_d0._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_d0._8_8_ == 0) {
            if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
              free((void *)local_d0._0_8_);
            }
            else {
              (*(*(_func_int ***)local_d0._32_8_)[3])();
            }
          }
        }
        local_d0._0_8_ = local_170._0_8_;
        local_d0._8_8_ = local_170._8_8_;
        local_d0._16_8_ = local_170._16_8_;
        local_d0._24_4_ = local_170._24_4_;
        local_d0._32_8_ = local_170._32_8_;
        stack0xffffffffffffff58 = local_170._40_16_;
        local_98 = local_138;
        local_90 = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
LAB_00367d12:
              local_d0._0_8_ = local_170._0_8_;
              local_d0._8_8_ = local_170._8_8_;
              local_d0._16_8_ = local_170._16_8_;
              local_d0._24_4_ = local_170._24_4_;
              local_d0._32_8_ = local_170._32_8_;
              unique0x1000214c = local_170._40_16_;
              local_98 = local_138;
              local_90 = local_130;
              free((void *)local_170._0_8_);
            }
            else {
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
      }
      else {
        Mat::reshape((Mat *)local_170,pMVar10,iVar12,1,(Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_d0._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_d0._8_8_ == 0) {
            if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
              free((void *)local_d0._0_8_);
            }
            else {
              (*(*(_func_int ***)local_d0._32_8_)[3])();
            }
          }
        }
        local_d0._0_8_ = local_170._0_8_;
        local_d0._8_8_ = local_170._8_8_;
        local_d0._16_8_ = local_170._16_8_;
        local_d0._24_4_ = local_170._24_4_;
        local_d0._32_8_ = local_170._32_8_;
        stack0xffffffffffffff58 = local_170._40_16_;
        local_98 = local_138;
        local_90 = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) goto LAB_00367d12;
            (*(*(_func_int ***)local_170._32_8_)[3])();
          }
        }
      }
    }
    if ((iVar13 == 3) && (pMVar10->dims == 1)) {
      iVar12 = pMVar10->w;
      if (iVar12 == pMVar10[1].c) {
        Mat::reshape((Mat *)local_170,pMVar10,1,1,iVar12,(Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_d0._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_d0._8_8_ == 0) {
            if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
              free((void *)local_d0._0_8_);
            }
            else {
              (*(*(_func_int ***)local_d0._32_8_)[3])();
            }
          }
        }
        local_d0._0_8_ = local_170._0_8_;
        local_d0._8_8_ = local_170._8_8_;
        local_d0._16_8_ = local_170._16_8_;
        local_d0._24_4_ = local_170._24_4_;
        local_d0._32_8_ = local_170._32_8_;
        stack0xffffffffffffff58 = local_170._40_16_;
        local_98 = local_138;
        local_90 = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
LAB_00367f24:
              local_d0._0_8_ = local_170._0_8_;
              local_d0._8_8_ = local_170._8_8_;
              local_d0._16_8_ = local_170._16_8_;
              local_d0._24_4_ = local_170._24_4_;
              local_d0._32_8_ = local_170._32_8_;
              unique0x1000215c = local_170._40_16_;
              local_98 = local_138;
              local_90 = local_130;
              free((void *)local_170._0_8_);
            }
            else {
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
      }
      else {
        Mat::reshape((Mat *)local_170,pMVar10,iVar12,1,1,(Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_d0._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_d0._8_8_ == 0) {
            if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
              free((void *)local_d0._0_8_);
            }
            else {
              (*(*(_func_int ***)local_d0._32_8_)[3])();
            }
          }
        }
        local_d0._0_8_ = local_170._0_8_;
        local_d0._8_8_ = local_170._8_8_;
        local_d0._16_8_ = local_170._16_8_;
        local_d0._24_4_ = local_170._24_4_;
        local_d0._32_8_ = local_170._32_8_;
        stack0xffffffffffffff58 = local_170._40_16_;
        local_98 = local_138;
        local_90 = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) goto LAB_00367f24;
            (*(*(_func_int ***)local_170._32_8_)[3])();
          }
        }
      }
    }
    if (pMVar10->dims == 2 && iVar13 == 3) {
      Mat::reshape((Mat *)local_170,pMVar10,1,pMVar10->w,pMVar10->h,(Allocator *)0x0);
      if ((int *)local_170._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
        UNLOCK();
      }
      if ((int *)local_d0._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_d0._8_8_ == 0) {
          if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
            free((void *)local_d0._0_8_);
          }
          else {
            (*(*(_func_int ***)local_d0._32_8_)[3])();
          }
        }
      }
      local_d0._0_8_ = local_170._0_8_;
      local_d0._8_8_ = local_170._8_8_;
      local_d0._16_8_ = local_170._16_8_;
      local_d0._24_4_ = local_170._24_4_;
      local_d0._32_8_ = local_170._32_8_;
      stack0xffffffffffffff58 = local_170._40_16_;
      local_98 = local_138;
      local_90 = local_130;
      if ((int *)local_170._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_170._8_8_ == 0) {
          if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
            free((void *)local_170._0_8_);
          }
          else {
            (*(*(_func_int ***)local_170._32_8_)[3])();
          }
        }
      }
      bVar32 = false;
    }
    else {
      bVar32 = iVar13 == 4;
      if (pMVar10->dims == 1 && bVar32) {
        iVar12 = pMVar10->w;
        if (iVar12 == pMVar10[1].c) {
          Mat::reshape((Mat *)local_170,pMVar10,1,1,1,iVar12,(Allocator *)0x0);
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
            UNLOCK();
          }
          if ((int *)local_d0._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_d0._8_8_ == 0) {
              if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
                free((void *)local_d0._0_8_);
              }
              else {
                (*(*(_func_int ***)local_d0._32_8_)[3])();
              }
            }
          }
          local_d0._0_8_ = local_170._0_8_;
          local_d0._8_8_ = local_170._8_8_;
          local_d0._16_8_ = local_170._16_8_;
          local_d0._24_4_ = local_170._24_4_;
          local_d0._32_8_ = local_170._32_8_;
          unique0x00006c80 = local_170._40_16_;
          local_98 = local_138;
          local_90 = local_130;
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_170._8_8_ == 0) {
              if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
LAB_00369ece:
                local_d0._0_8_ = local_170._0_8_;
                local_d0._8_8_ = local_170._8_8_;
                local_d0._16_8_ = local_170._16_8_;
                local_d0._24_4_ = local_170._24_4_;
                local_d0._32_8_ = local_170._32_8_;
                unique0x1000216c = local_170._40_16_;
                local_98 = local_138;
                local_90 = local_130;
                free((void *)local_170._0_8_);
              }
              else {
                (*(*(_func_int ***)local_170._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_170,pMVar10,iVar12,1,1,1,(Allocator *)0x0);
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
            UNLOCK();
          }
          if ((int *)local_d0._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_d0._8_8_ == 0) {
              if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
                free((void *)local_d0._0_8_);
              }
              else {
                (*(*(_func_int ***)local_d0._32_8_)[3])();
              }
            }
          }
          local_d0._0_8_ = local_170._0_8_;
          local_d0._8_8_ = local_170._8_8_;
          local_d0._16_8_ = local_170._16_8_;
          local_d0._24_4_ = local_170._24_4_;
          local_d0._32_8_ = local_170._32_8_;
          stack0xffffffffffffff58 = local_170._40_16_;
          local_98 = local_138;
          local_90 = local_130;
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_170._8_8_ == 0) {
              if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) goto LAB_00369ece;
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
      }
    }
    iVar12 = pMVar10->dims;
    if ((bool)(iVar12 == 2 & bVar32)) {
      Mat::reshape((Mat *)local_170,pMVar10,1,1,pMVar10->w,pMVar10->h,(Allocator *)0x0);
      if ((int *)local_170._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
        UNLOCK();
      }
      if ((int *)local_d0._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_d0._8_8_ == 0) {
          if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
            free((void *)local_d0._0_8_);
          }
          else {
            (*(*(_func_int ***)local_d0._32_8_)[3])();
          }
        }
      }
      local_d0._0_8_ = local_170._0_8_;
      local_d0._8_8_ = local_170._8_8_;
      local_d0._16_8_ = local_170._16_8_;
      local_d0._24_4_ = local_170._24_4_;
      local_d0._32_8_ = local_170._32_8_;
      stack0xffffffffffffff58 = local_170._40_16_;
      local_98 = local_138;
      local_90 = local_130;
      if ((int *)local_170._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_170._8_8_ == 0) {
          if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
            free((void *)local_170._0_8_);
          }
          else {
            (*(*(_func_int ***)local_170._32_8_)[3])();
          }
        }
      }
      iVar12 = pMVar10->dims;
    }
    if (!(bool)(bVar32 & iVar12 == 3)) goto LAB_003682ba;
    Mat::reshape((Mat *)local_170,pMVar10,1,pMVar10->w,pMVar10->h,pMVar10->c,(Allocator *)0x0);
    if ((int *)local_170._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
      UNLOCK();
    }
    if ((int *)local_d0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_d0._8_8_ == 0) {
        if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
          free((void *)local_d0._0_8_);
        }
        else {
          (*(*(_func_int ***)local_d0._32_8_)[3])();
        }
      }
    }
    local_d0._0_8_ = local_170._0_8_;
    local_d0._8_8_ = local_170._8_8_;
    local_d0._16_8_ = local_170._16_8_;
    local_d0._24_4_ = local_170._24_4_;
    local_d0._32_8_ = local_170._32_8_;
    stack0xffffffffffffff58 = local_170._40_16_;
    local_98 = local_138;
    local_90 = local_130;
    if ((int *)local_170._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_170._8_8_ == 0) {
        if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
          free((void *)local_170._0_8_);
        }
        else {
          (*(*(_func_int ***)local_170._32_8_)[3])();
        }
      }
    }
    if (pMVar10[1].dims < 4) goto LAB_00368559;
  }
  else {
LAB_003682ba:
    if (pMVar10[1].dims < iVar13) {
      if (iVar13 == 2) {
        iVar12 = pMVar10[1].w;
        if (iVar12 == pMVar10->h) {
          Mat::reshape((Mat *)local_170,pMVar22,1,iVar12,(Allocator *)0x0);
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
            UNLOCK();
          }
          if (local_118.refcount != (int *)0x0) {
            LOCK();
            *local_118.refcount = *local_118.refcount + -1;
            UNLOCK();
            if (*local_118.refcount == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                free(local_118.data);
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_118.data = (void *)local_170._0_8_;
          local_118.refcount = (int *)local_170._8_8_;
          local_118.elemsize = local_170._16_8_;
          local_118.elempack = local_170._24_4_;
          local_118.allocator = (Allocator *)local_170._32_8_;
          local_118.dims = local_170._40_4_;
          local_118.w = local_170._44_4_;
          local_118.h = local_170._48_4_;
          local_118.d = local_170._52_4_;
          local_118.c = local_138;
          local_118.cstep = local_130;
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_170._8_8_ == 0) {
              if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
LAB_00368551:
                local_118.data = (void *)local_170._0_8_;
                local_118.refcount = (int *)local_170._8_8_;
                local_118.elemsize = local_170._16_8_;
                local_118.elempack = local_170._24_4_;
                local_118.allocator = (Allocator *)local_170._32_8_;
                local_118.c = local_138;
                local_118.cstep = local_130;
                free((void *)local_170._0_8_);
              }
              else {
                (*(*(_func_int ***)local_170._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_170,pMVar22,iVar12,1,(Allocator *)0x0);
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
            UNLOCK();
          }
          if (local_118.refcount != (int *)0x0) {
            LOCK();
            *local_118.refcount = *local_118.refcount + -1;
            UNLOCK();
            if (*local_118.refcount == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                free(local_118.data);
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_118.data = (void *)local_170._0_8_;
          local_118.refcount = (int *)local_170._8_8_;
          local_118.elemsize = local_170._16_8_;
          local_118.elempack = local_170._24_4_;
          local_118.allocator = (Allocator *)local_170._32_8_;
          local_118.dims = local_170._40_4_;
          local_118.w = local_170._44_4_;
          local_118.h = local_170._48_4_;
          local_118.d = local_170._52_4_;
          local_118.c = local_138;
          local_118.cstep = local_130;
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_170._8_8_ == 0) {
              if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) goto LAB_00368551;
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
      }
LAB_00368559:
      if ((iVar13 == 3) && (pMVar10[1].dims == 1)) {
        iVar12 = pMVar10[1].w;
        if (iVar12 == pMVar10->c) {
          Mat::reshape((Mat *)local_170,pMVar22,1,1,iVar12,(Allocator *)0x0);
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
            UNLOCK();
          }
          if (local_118.refcount != (int *)0x0) {
            LOCK();
            *local_118.refcount = *local_118.refcount + -1;
            UNLOCK();
            if (*local_118.refcount == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                free(local_118.data);
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_118.data = (void *)local_170._0_8_;
          local_118.refcount = (int *)local_170._8_8_;
          local_118.elemsize = local_170._16_8_;
          local_118.elempack = local_170._24_4_;
          local_118.allocator = (Allocator *)local_170._32_8_;
          local_118.dims = local_170._40_4_;
          local_118.w = local_170._44_4_;
          local_118.h = local_170._48_4_;
          local_118.d = local_170._52_4_;
          local_118.c = local_138;
          local_118.cstep = local_130;
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_170._8_8_ == 0) {
              if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
LAB_00368748:
                local_118.data = (void *)local_170._0_8_;
                local_118.refcount = (int *)local_170._8_8_;
                local_118.elemsize = local_170._16_8_;
                local_118.elempack = local_170._24_4_;
                local_118.allocator = (Allocator *)local_170._32_8_;
                local_118.c = local_138;
                local_118.cstep = local_130;
                free((void *)local_170._0_8_);
              }
              else {
                (*(*(_func_int ***)local_170._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_170,pMVar22,iVar12,1,1,(Allocator *)0x0);
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
            UNLOCK();
          }
          if (local_118.refcount != (int *)0x0) {
            LOCK();
            *local_118.refcount = *local_118.refcount + -1;
            UNLOCK();
            if (*local_118.refcount == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                free(local_118.data);
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_118.data = (void *)local_170._0_8_;
          local_118.refcount = (int *)local_170._8_8_;
          local_118.elemsize = local_170._16_8_;
          local_118.elempack = local_170._24_4_;
          local_118.allocator = (Allocator *)local_170._32_8_;
          local_118.dims = local_170._40_4_;
          local_118.w = local_170._44_4_;
          local_118.h = local_170._48_4_;
          local_118.d = local_170._52_4_;
          local_118.c = local_138;
          local_118.cstep = local_130;
          if ((int *)local_170._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_170._8_8_ == 0) {
              if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) goto LAB_00368748;
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
      }
      if (pMVar10[1].dims == 2 && iVar13 == 3) {
        Mat::reshape((Mat *)local_170,pMVar22,1,pMVar10[1].w,pMVar10[1].h,(Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + -1;
          UNLOCK();
          if (*local_118.refcount == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              free(local_118.data);
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_118.data = (void *)local_170._0_8_;
        local_118.refcount = (int *)local_170._8_8_;
        local_118.elemsize = local_170._16_8_;
        local_118.elempack = local_170._24_4_;
        local_118.allocator = (Allocator *)local_170._32_8_;
        local_118.dims = local_170._40_4_;
        local_118.w = local_170._44_4_;
        local_118.h = local_170._48_4_;
        local_118.d = local_170._52_4_;
        local_118.c = local_138;
        local_118.cstep = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
              free((void *)local_170._0_8_);
            }
            else {
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
        bVar32 = false;
      }
      else {
        bVar32 = iVar13 == 4;
        if (pMVar10[1].dims == 1 && bVar32) {
          iVar12 = pMVar10[1].w;
          if (iVar12 == pMVar10->c) {
            Mat::reshape((Mat *)local_170,pMVar22,1,1,1,iVar12,(Allocator *)0x0);
            if ((int *)local_170._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
              UNLOCK();
            }
            if (local_118.refcount != (int *)0x0) {
              LOCK();
              *local_118.refcount = *local_118.refcount + -1;
              UNLOCK();
              if (*local_118.refcount == 0) {
                if (local_118.allocator == (Allocator *)0x0) {
                  free(local_118.data);
                }
                else {
                  (*(local_118.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_118.data = (void *)local_170._0_8_;
            local_118.refcount = (int *)local_170._8_8_;
            local_118.elemsize = local_170._16_8_;
            local_118.elempack = local_170._24_4_;
            local_118.allocator = (Allocator *)local_170._32_8_;
            local_118.dims = local_170._40_4_;
            local_118.w = local_170._44_4_;
            local_118.h = local_170._48_4_;
            local_118.d = local_170._52_4_;
            local_118.c = local_138;
            local_118.cstep = local_130;
            if ((int *)local_170._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_170._8_8_ == 0) {
                if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
LAB_0036a003:
                  local_118.data = (void *)local_170._0_8_;
                  local_118.refcount = (int *)local_170._8_8_;
                  local_118.elemsize = local_170._16_8_;
                  local_118.elempack = local_170._24_4_;
                  local_118.allocator = (Allocator *)local_170._32_8_;
                  local_118.c = local_138;
                  local_118.cstep = local_130;
                  free((void *)local_170._0_8_);
                }
                else {
                  (*(*(_func_int ***)local_170._32_8_)[3])();
                }
              }
            }
          }
          else {
            Mat::reshape((Mat *)local_170,pMVar22,iVar12,1,1,1,(Allocator *)0x0);
            if ((int *)local_170._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
              UNLOCK();
            }
            if (local_118.refcount != (int *)0x0) {
              LOCK();
              *local_118.refcount = *local_118.refcount + -1;
              UNLOCK();
              if (*local_118.refcount == 0) {
                if (local_118.allocator == (Allocator *)0x0) {
                  free(local_118.data);
                }
                else {
                  (*(local_118.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_118.data = (void *)local_170._0_8_;
            local_118.refcount = (int *)local_170._8_8_;
            local_118.elemsize = local_170._16_8_;
            local_118.elempack = local_170._24_4_;
            local_118.allocator = (Allocator *)local_170._32_8_;
            local_118.dims = local_170._40_4_;
            local_118.w = local_170._44_4_;
            local_118.h = local_170._48_4_;
            local_118.d = local_170._52_4_;
            local_118.c = local_138;
            local_118.cstep = local_130;
            if ((int *)local_170._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_170._8_8_ == 0) {
                if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) goto LAB_0036a003;
                (*(*(_func_int ***)local_170._32_8_)[3])();
              }
            }
          }
        }
      }
      iVar12 = pMVar10[1].dims;
      if ((bool)(iVar12 == 2 & bVar32)) {
        Mat::reshape((Mat *)local_170,pMVar22,1,1,pMVar10[1].w,pMVar10[1].h,(Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + -1;
          UNLOCK();
          if (*local_118.refcount == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              free(local_118.data);
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_118.data = (void *)local_170._0_8_;
        local_118.refcount = (int *)local_170._8_8_;
        local_118.elemsize = local_170._16_8_;
        local_118.elempack = local_170._24_4_;
        local_118.allocator = (Allocator *)local_170._32_8_;
        local_118.dims = local_170._40_4_;
        local_118.w = local_170._44_4_;
        local_118.h = local_170._48_4_;
        local_118.d = local_170._52_4_;
        local_118.c = local_138;
        local_118.cstep = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
              free((void *)local_170._0_8_);
            }
            else {
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
        iVar12 = pMVar10[1].dims;
      }
      if ((bool)(bVar32 & iVar12 == 3)) {
        Mat::reshape((Mat *)local_170,pMVar22,1,pMVar10[1].w,pMVar10[1].h,pMVar10[1].c,
                     (Allocator *)0x0);
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
          UNLOCK();
        }
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + -1;
          UNLOCK();
          if (*local_118.refcount == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              free(local_118.data);
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_118.data = (void *)local_170._0_8_;
        local_118.refcount = (int *)local_170._8_8_;
        local_118.elemsize = local_170._16_8_;
        local_118.elempack = local_170._24_4_;
        local_118.allocator = (Allocator *)local_170._32_8_;
        local_118.dims = local_170._40_4_;
        local_118.w = local_170._44_4_;
        local_118.h = local_170._48_4_;
        local_118.d = local_170._52_4_;
        local_118.c = local_138;
        local_118.cstep = local_130;
        if ((int *)local_170._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_170._8_8_ == 0) {
            if ((Allocator *)local_170._32_8_ == (Allocator *)0x0) {
              free((void *)local_170._0_8_);
            }
            else {
              (*(*(_func_int ***)local_170._32_8_)[3])();
            }
          }
        }
      }
    }
  }
  iVar12 = local_118.w;
  if (local_118.w < iStack_a4) {
    iVar12 = iStack_a4;
  }
  _h = local_118.h;
  if (local_118.h < (int)uStack_a0) {
    _h = (int)uStack_a0;
  }
  _c = local_118.c;
  if (local_118.c < local_98) {
    _c = local_98;
  }
  pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(iVar13) {
  case 1:
    Mat::create(pMVar10,iVar12,4,opt->blob_allocator);
    break;
  case 2:
    Mat::create(pMVar10,iVar12,_h,4,opt->blob_allocator);
    break;
  case 3:
    Mat::create(pMVar10,iVar12,_h,_c,4,opt->blob_allocator);
    break;
  case 4:
    iVar13 = local_118.d;
    if (local_118.d < uStack_a0._4_4_) {
      iVar13 = uStack_a0._4_4_;
    }
    Mat::create(pMVar10,iVar12,_h,iVar13,_c,4,opt->blob_allocator);
  }
  opt_00 = (Option *)pMVar10->data;
  iVar13 = -100;
  if (opt_00 == (Option *)0x0) goto switchD_00368c3c_default;
  uVar8 = pMVar10->c;
  local_68 = (ulong)(int)uVar8;
  if (pMVar10->cstep * local_68 == 0) goto switchD_00368c3c_default;
  iVar13 = 0;
  switch(local_120->op_type) {
  case 0:
    iVar12 = pMVar10->dims;
    uVar14 = pMVar10->h;
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    uVar9 = pMVar10->w;
    local_128 = (long)(int)uVar9;
    uVar15 = pMVar10->d;
    local_88 = CONCAT44(local_88._4_4_,iVar12);
    if (iVar12 == 2) {
      local_78 = (float *)local_d0._0_8_;
      local_80 = (float *)local_118.data;
      uVar25 = 0;
      uVar24 = 0;
      if (0 < (int)uVar9) {
        uVar24 = (ulong)uVar9;
      }
      uVar28 = 0;
      if (0 < (int)uVar14) {
        uVar28 = (ulong)uVar14;
      }
      sVar11 = pMVar10->elemsize;
      while( true ) {
        uVar26 = (long)(local_118.h + -1);
        if ((long)uVar25 < (long)(local_118.h + -1)) {
          uVar26 = uVar25;
        }
        uVar16 = (long)((int)uStack_a0 + -1);
        if ((long)uVar25 < (long)((int)uStack_a0 + -1)) {
          uVar16 = uVar25;
        }
        if (uVar25 == uVar28) break;
        pfVar18 = (float *)(uVar26 * (long)local_118.w * local_118.elemsize + (long)local_118.data);
        pfVar30 = (float *)(uVar16 * (long)iStack_a4 * local_d0._16_8_ + local_d0._0_8_);
        for (uVar26 = 0; uVar24 != uVar26; uVar26 = uVar26 + 1) {
          *(float *)(&opt_00->lightmode + uVar26 * 4) = *pfVar18 + *pfVar30;
          pfVar18 = pfVar18 + (1 < (long)local_118.w);
          pfVar30 = pfVar30 + (1 < (long)iStack_a4);
        }
        uVar25 = uVar25 + 1;
        opt_00 = (Option *)(&opt_00->lightmode + sVar11 * local_128);
      }
    }
    else if (iVar12 == 1) {
      uVar24 = 0;
      uVar25 = 0;
      if (0 < (int)uVar9) {
        uVar25 = (ulong)uVar9;
      }
      pfVar18 = (float *)local_d0._0_8_;
      pfVar30 = (float *)local_118.data;
      for (; uVar25 != uVar24; uVar24 = uVar24 + 1) {
        *(float *)(&opt_00->lightmode + uVar24 * 4) = *pfVar30 + *pfVar18;
        pfVar30 = pfVar30 + (1 < local_118.w);
        pfVar18 = pfVar18 + (1 < iStack_a4);
      }
    }
    iVar13 = 0;
    if (1 < iVar12 - 3U) goto switchD_00368c3c_default;
    local_58 = pMVar10->elemsize * pMVar10->cstep;
    uVar24 = 0;
    if (0 < (int)uVar9) {
      uVar24 = (ulong)uVar9;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    local_60 = pMVar10->data;
    local_68 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      local_68 = 0;
    }
    local_128 = local_128 * 4;
    uVar25 = 0;
    while (uVar28 = uVar25, uVar28 != local_68) {
      pvVar31 = (void *)(local_58 * uVar28 + (long)local_60);
      lVar19 = 0;
      while (lVar27 = lVar19, (uint)lVar27 != uVar15) {
        local_78 = (float *)(long)iStack_a4;
        local_80 = (float *)local_d0._0_8_;
        local_88 = local_d0._16_8_;
        local_6c = (int)uStack_a0 + -1;
        local_38 = (long)local_118.w;
        local_40 = (float *)local_118.data;
        uVar25 = (long)(local_98 + -1);
        if ((long)uVar28 < (long)(local_98 + -1)) {
          uVar25 = uVar28;
        }
        lVar19 = (long)(uStack_a0._4_4_ + -1);
        if (lVar27 < uStack_a0._4_4_ + -1) {
          lVar19 = lVar27;
        }
        uVar26 = (long)(local_118.c + -1);
        if ((long)uVar28 < (long)(local_118.c + -1)) {
          uVar26 = uVar28;
        }
        lVar23 = (long)(local_118.d + -1);
        if (lVar27 < local_118.d + -1) {
          lVar23 = lVar27;
        }
        lVar20 = 0;
        while( true ) {
          lVar17 = (long)local_6c;
          if (lVar20 < local_6c) {
            lVar17 = lVar20;
          }
          lVar29 = (long)(local_118.h + -1);
          if (lVar20 < local_118.h + -1) {
            lVar29 = lVar20;
          }
          if ((uint)lVar20 == uVar14) break;
          pfVar18 = (float *)(((lVar17 + lVar19 * (int)uStack_a0) * (long)local_78 +
                              uVar25 * local_90) * local_d0._16_8_ + local_d0._0_8_);
          pfVar30 = (float *)(((lVar29 + lVar23 * local_118.h) * local_38 + uVar26 * local_118.cstep
                              ) * local_118.elemsize + (long)local_118.data);
          for (uVar16 = 0; uVar24 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar31 + uVar16 * 4) = *pfVar30 + *pfVar18;
            pfVar18 = pfVar18 + (1 < iStack_a4);
            pfVar30 = pfVar30 + (1 < local_118.w);
          }
          pvVar31 = (void *)((long)pvVar31 + local_128);
          lVar20 = lVar20 + 1;
        }
        local_48 = lVar27;
        lVar19 = lVar27 + 1;
      }
      local_50 = uVar28;
      uVar25 = uVar28 + 1;
    }
    break;
  case 1:
    pMVar22 = (Mat *)local_d0;
    pMVar21 = &local_118;
    goto LAB_00368e64;
  case 2:
    iVar12 = pMVar10->dims;
    uVar14 = pMVar10->h;
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    uVar9 = pMVar10->w;
    local_128 = (long)(int)uVar9;
    uVar15 = pMVar10->d;
    local_88 = CONCAT44(local_88._4_4_,iVar12);
    if (iVar12 == 2) {
      local_78 = (float *)local_d0._0_8_;
      local_80 = (float *)local_118.data;
      uVar25 = 0;
      uVar24 = 0;
      if (0 < (int)uVar9) {
        uVar24 = (ulong)uVar9;
      }
      uVar28 = 0;
      if (0 < (int)uVar14) {
        uVar28 = (ulong)uVar14;
      }
      sVar11 = pMVar10->elemsize;
      while( true ) {
        uVar26 = (long)(local_118.h + -1);
        if ((long)uVar25 < (long)(local_118.h + -1)) {
          uVar26 = uVar25;
        }
        uVar16 = (long)((int)uStack_a0 + -1);
        if ((long)uVar25 < (long)((int)uStack_a0 + -1)) {
          uVar16 = uVar25;
        }
        if (uVar25 == uVar28) break;
        pfVar18 = (float *)(uVar26 * (long)local_118.w * local_118.elemsize + (long)local_118.data);
        pfVar30 = (float *)(uVar16 * (long)iStack_a4 * local_d0._16_8_ + local_d0._0_8_);
        for (uVar26 = 0; uVar24 != uVar26; uVar26 = uVar26 + 1) {
          *(float *)(&opt_00->lightmode + uVar26 * 4) = *pfVar18 * *pfVar30;
          pfVar18 = pfVar18 + (1 < (long)local_118.w);
          pfVar30 = pfVar30 + (1 < (long)iStack_a4);
        }
        uVar25 = uVar25 + 1;
        opt_00 = (Option *)(&opt_00->lightmode + sVar11 * local_128);
      }
    }
    else if (iVar12 == 1) {
      uVar24 = 0;
      uVar25 = 0;
      if (0 < (int)uVar9) {
        uVar25 = (ulong)uVar9;
      }
      pfVar18 = (float *)local_d0._0_8_;
      pfVar30 = (float *)local_118.data;
      for (; uVar25 != uVar24; uVar24 = uVar24 + 1) {
        *(float *)(&opt_00->lightmode + uVar24 * 4) = *pfVar30 * *pfVar18;
        pfVar30 = pfVar30 + (1 < local_118.w);
        pfVar18 = pfVar18 + (1 < iStack_a4);
      }
    }
    iVar13 = 0;
    if (1 < iVar12 - 3U) goto switchD_00368c3c_default;
    local_58 = pMVar10->elemsize * pMVar10->cstep;
    uVar24 = 0;
    if (0 < (int)uVar9) {
      uVar24 = (ulong)uVar9;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    local_60 = pMVar10->data;
    local_68 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      local_68 = 0;
    }
    local_128 = local_128 * 4;
    uVar25 = 0;
    while (uVar28 = uVar25, uVar28 != local_68) {
      pvVar31 = (void *)(local_58 * uVar28 + (long)local_60);
      lVar19 = 0;
      while (lVar27 = lVar19, (uint)lVar27 != uVar15) {
        local_78 = (float *)(long)iStack_a4;
        local_80 = (float *)local_d0._0_8_;
        local_88 = local_d0._16_8_;
        local_6c = (int)uStack_a0 + -1;
        local_38 = (long)local_118.w;
        local_40 = (float *)local_118.data;
        uVar25 = (long)(local_98 + -1);
        if ((long)uVar28 < (long)(local_98 + -1)) {
          uVar25 = uVar28;
        }
        lVar19 = (long)(uStack_a0._4_4_ + -1);
        if (lVar27 < uStack_a0._4_4_ + -1) {
          lVar19 = lVar27;
        }
        uVar26 = (long)(local_118.c + -1);
        if ((long)uVar28 < (long)(local_118.c + -1)) {
          uVar26 = uVar28;
        }
        lVar23 = (long)(local_118.d + -1);
        if (lVar27 < local_118.d + -1) {
          lVar23 = lVar27;
        }
        lVar20 = 0;
        while( true ) {
          lVar17 = (long)local_6c;
          if (lVar20 < local_6c) {
            lVar17 = lVar20;
          }
          lVar29 = (long)(local_118.h + -1);
          if (lVar20 < local_118.h + -1) {
            lVar29 = lVar20;
          }
          if ((uint)lVar20 == uVar14) break;
          pfVar18 = (float *)(((lVar17 + lVar19 * (int)uStack_a0) * (long)local_78 +
                              uVar25 * local_90) * local_d0._16_8_ + local_d0._0_8_);
          pfVar30 = (float *)(((lVar29 + lVar23 * local_118.h) * local_38 + uVar26 * local_118.cstep
                              ) * local_118.elemsize + (long)local_118.data);
          for (uVar16 = 0; uVar24 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar31 + uVar16 * 4) = *pfVar30 * *pfVar18;
            pfVar18 = pfVar18 + (1 < iStack_a4);
            pfVar30 = pfVar30 + (1 < local_118.w);
          }
          pvVar31 = (void *)((long)pvVar31 + local_128);
          lVar20 = lVar20 + 1;
        }
        local_48 = lVar27;
        lVar19 = lVar27 + 1;
      }
      local_50 = uVar28;
      uVar25 = uVar28 + 1;
    }
    break;
  case 3:
    pMVar21 = (Mat *)local_d0;
    pMVar22 = &local_118;
    goto LAB_00368f48;
  case 4:
    iVar12 = pMVar10->dims;
    uVar14 = pMVar10->h;
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    uVar9 = pMVar10->w;
    local_128 = (long)(int)uVar9;
    uVar15 = pMVar10->d;
    local_88 = CONCAT44(local_88._4_4_,iVar12);
    if (iVar12 == 2) {
      local_78 = (float *)local_d0._0_8_;
      local_80 = (float *)local_118.data;
      uVar25 = 0;
      uVar24 = 0;
      if (0 < (int)uVar9) {
        uVar24 = (ulong)uVar9;
      }
      uVar28 = 0;
      if (0 < (int)uVar14) {
        uVar28 = (ulong)uVar14;
      }
      sVar11 = pMVar10->elemsize;
      while( true ) {
        uVar26 = (long)(local_118.h + -1);
        if ((long)uVar25 < (long)(local_118.h + -1)) {
          uVar26 = uVar25;
        }
        uVar16 = (long)((int)uStack_a0 + -1);
        if ((long)uVar25 < (long)((int)uStack_a0 + -1)) {
          uVar16 = uVar25;
        }
        if (uVar25 == uVar28) break;
        pfVar18 = (float *)(uVar26 * (long)local_118.w * local_118.elemsize + (long)local_118.data);
        pfVar30 = (float *)(uVar16 * (long)iStack_a4 * local_d0._16_8_ + local_d0._0_8_);
        for (uVar26 = 0; uVar24 != uVar26; uVar26 = uVar26 + 1) {
          fVar1 = *pfVar18;
          if (*pfVar18 <= *pfVar30) {
            fVar1 = *pfVar30;
          }
          *(float *)(&opt_00->lightmode + uVar26 * 4) = fVar1;
          pfVar18 = pfVar18 + (1 < (long)local_118.w);
          pfVar30 = pfVar30 + (1 < (long)iStack_a4);
        }
        uVar25 = uVar25 + 1;
        opt_00 = (Option *)(&opt_00->lightmode + sVar11 * local_128);
      }
    }
    else if (iVar12 == 1) {
      uVar24 = 0;
      uVar25 = 0;
      if (0 < (int)uVar9) {
        uVar25 = (ulong)uVar9;
      }
      pfVar18 = (float *)local_d0._0_8_;
      pfVar30 = (float *)local_118.data;
      for (; uVar25 != uVar24; uVar24 = uVar24 + 1) {
        fVar1 = *pfVar30;
        if (*pfVar30 <= *pfVar18) {
          fVar1 = *pfVar18;
        }
        *(float *)(&opt_00->lightmode + uVar24 * 4) = fVar1;
        pfVar30 = pfVar30 + (1 < local_118.w);
        pfVar18 = pfVar18 + (1 < iStack_a4);
      }
    }
    iVar13 = 0;
    if (1 < iVar12 - 3U) goto switchD_00368c3c_default;
    local_58 = pMVar10->elemsize * pMVar10->cstep;
    uVar24 = 0;
    if (0 < (int)uVar9) {
      uVar24 = (ulong)uVar9;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    local_60 = pMVar10->data;
    local_68 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      local_68 = 0;
    }
    local_128 = local_128 * 4;
    uVar25 = 0;
    while (uVar28 = uVar25, uVar28 != local_68) {
      pvVar31 = (void *)(local_58 * uVar28 + (long)local_60);
      lVar19 = 0;
      while (lVar27 = lVar19, (uint)lVar27 != uVar15) {
        local_78 = (float *)(long)iStack_a4;
        local_80 = (float *)local_d0._0_8_;
        local_88 = local_d0._16_8_;
        local_6c = (int)uStack_a0 + -1;
        local_38 = (long)local_118.w;
        local_40 = (float *)local_118.data;
        uVar25 = (long)(local_98 + -1);
        if ((long)uVar28 < (long)(local_98 + -1)) {
          uVar25 = uVar28;
        }
        lVar19 = (long)(uStack_a0._4_4_ + -1);
        if (lVar27 < uStack_a0._4_4_ + -1) {
          lVar19 = lVar27;
        }
        uVar26 = (long)(local_118.c + -1);
        if ((long)uVar28 < (long)(local_118.c + -1)) {
          uVar26 = uVar28;
        }
        lVar23 = (long)(local_118.d + -1);
        if (lVar27 < local_118.d + -1) {
          lVar23 = lVar27;
        }
        lVar20 = 0;
        while( true ) {
          lVar17 = (long)local_6c;
          if (lVar20 < local_6c) {
            lVar17 = lVar20;
          }
          lVar29 = (long)(local_118.h + -1);
          if (lVar20 < local_118.h + -1) {
            lVar29 = lVar20;
          }
          if ((uint)lVar20 == uVar14) break;
          pfVar18 = (float *)(((lVar17 + lVar19 * (int)uStack_a0) * (long)local_78 +
                              uVar25 * local_90) * local_d0._16_8_ + local_d0._0_8_);
          pfVar30 = (float *)(((lVar29 + lVar23 * local_118.h) * local_38 + uVar26 * local_118.cstep
                              ) * local_118.elemsize + (long)local_118.data);
          for (uVar16 = 0; uVar24 != uVar16; uVar16 = uVar16 + 1) {
            fVar1 = *pfVar30;
            if (*pfVar30 <= *pfVar18) {
              fVar1 = *pfVar18;
            }
            *(float *)((long)pvVar31 + uVar16 * 4) = fVar1;
            pfVar18 = pfVar18 + (1 < iStack_a4);
            pfVar30 = pfVar30 + (1 < local_118.w);
          }
          pvVar31 = (void *)((long)pvVar31 + local_128);
          lVar20 = lVar20 + 1;
        }
        local_48 = lVar27;
        lVar19 = lVar27 + 1;
      }
      local_50 = uVar28;
      uVar25 = uVar28 + 1;
    }
    break;
  case 5:
    iVar12 = pMVar10->dims;
    uVar14 = pMVar10->h;
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    uVar9 = pMVar10->w;
    local_128 = (long)(int)uVar9;
    uVar15 = pMVar10->d;
    local_88 = CONCAT44(local_88._4_4_,iVar12);
    if (iVar12 == 2) {
      local_78 = (float *)local_d0._0_8_;
      local_80 = (float *)local_118.data;
      uVar25 = 0;
      uVar24 = 0;
      if (0 < (int)uVar9) {
        uVar24 = (ulong)uVar9;
      }
      uVar28 = 0;
      if (0 < (int)uVar14) {
        uVar28 = (ulong)uVar14;
      }
      sVar11 = pMVar10->elemsize;
      while( true ) {
        uVar26 = (long)(local_118.h + -1);
        if ((long)uVar25 < (long)(local_118.h + -1)) {
          uVar26 = uVar25;
        }
        uVar16 = (long)((int)uStack_a0 + -1);
        if ((long)uVar25 < (long)((int)uStack_a0 + -1)) {
          uVar16 = uVar25;
        }
        if (uVar25 == uVar28) break;
        pfVar18 = (float *)(uVar26 * (long)local_118.w * local_118.elemsize + (long)local_118.data);
        pfVar30 = (float *)(uVar16 * (long)iStack_a4 * local_d0._16_8_ + local_d0._0_8_);
        for (uVar26 = 0; uVar24 != uVar26; uVar26 = uVar26 + 1) {
          fVar1 = *pfVar18;
          if (*pfVar30 <= *pfVar18) {
            fVar1 = *pfVar30;
          }
          *(float *)(&opt_00->lightmode + uVar26 * 4) = fVar1;
          pfVar18 = pfVar18 + (1 < (long)local_118.w);
          pfVar30 = pfVar30 + (1 < (long)iStack_a4);
        }
        uVar25 = uVar25 + 1;
        opt_00 = (Option *)(&opt_00->lightmode + sVar11 * local_128);
      }
    }
    else if (iVar12 == 1) {
      uVar24 = 0;
      uVar25 = 0;
      if (0 < (int)uVar9) {
        uVar25 = (ulong)uVar9;
      }
      pfVar18 = (float *)local_d0._0_8_;
      pfVar30 = (float *)local_118.data;
      for (; uVar25 != uVar24; uVar24 = uVar24 + 1) {
        fVar1 = *pfVar30;
        if (*pfVar18 <= *pfVar30) {
          fVar1 = *pfVar18;
        }
        *(float *)(&opt_00->lightmode + uVar24 * 4) = fVar1;
        pfVar30 = pfVar30 + (1 < local_118.w);
        pfVar18 = pfVar18 + (1 < iStack_a4);
      }
    }
    iVar13 = 0;
    if (1 < iVar12 - 3U) goto switchD_00368c3c_default;
    local_58 = pMVar10->elemsize * pMVar10->cstep;
    uVar24 = 0;
    if (0 < (int)uVar9) {
      uVar24 = (ulong)uVar9;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    local_120 = (BinaryOp *)CONCAT44(local_120._4_4_,uVar14);
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    local_60 = pMVar10->data;
    local_68 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      local_68 = 0;
    }
    local_128 = local_128 * 4;
    uVar25 = 0;
    while (uVar28 = uVar25, uVar28 != local_68) {
      pvVar31 = (void *)(local_58 * uVar28 + (long)local_60);
      lVar19 = 0;
      while (lVar27 = lVar19, (uint)lVar27 != uVar15) {
        local_78 = (float *)(long)iStack_a4;
        local_80 = (float *)local_d0._0_8_;
        local_88 = local_d0._16_8_;
        local_6c = (int)uStack_a0 + -1;
        local_38 = (long)local_118.w;
        local_40 = (float *)local_118.data;
        uVar25 = (long)(local_98 + -1);
        if ((long)uVar28 < (long)(local_98 + -1)) {
          uVar25 = uVar28;
        }
        lVar19 = (long)(uStack_a0._4_4_ + -1);
        if (lVar27 < uStack_a0._4_4_ + -1) {
          lVar19 = lVar27;
        }
        uVar26 = (long)(local_118.c + -1);
        if ((long)uVar28 < (long)(local_118.c + -1)) {
          uVar26 = uVar28;
        }
        lVar23 = (long)(local_118.d + -1);
        if (lVar27 < local_118.d + -1) {
          lVar23 = lVar27;
        }
        lVar20 = 0;
        while( true ) {
          lVar17 = (long)local_6c;
          if (lVar20 < local_6c) {
            lVar17 = lVar20;
          }
          lVar29 = (long)(local_118.h + -1);
          if (lVar20 < local_118.h + -1) {
            lVar29 = lVar20;
          }
          if ((uint)lVar20 == uVar14) break;
          pfVar18 = (float *)(((lVar17 + lVar19 * (int)uStack_a0) * (long)local_78 +
                              uVar25 * local_90) * local_d0._16_8_ + local_d0._0_8_);
          pfVar30 = (float *)(((lVar29 + lVar23 * local_118.h) * local_38 + uVar26 * local_118.cstep
                              ) * local_118.elemsize + (long)local_118.data);
          for (uVar16 = 0; uVar24 != uVar16; uVar16 = uVar16 + 1) {
            fVar1 = *pfVar30;
            if (*pfVar18 <= *pfVar30) {
              fVar1 = *pfVar18;
            }
            *(float *)((long)pvVar31 + uVar16 * 4) = fVar1;
            pfVar18 = pfVar18 + (1 < iStack_a4);
            pfVar30 = pfVar30 + (1 < local_118.w);
          }
          pvVar31 = (void *)((long)pvVar31 + local_128);
          lVar20 = lVar20 + 1;
        }
        local_48 = lVar27;
        lVar19 = lVar27 + 1;
      }
      local_50 = uVar28;
      uVar25 = uVar28 + 1;
    }
    break;
  case 6:
    pMVar22 = (Mat *)local_d0;
    pMVar21 = &local_118;
    goto LAB_00368f1a;
  case 7:
    pMVar22 = &local_118;
    pMVar21 = (Mat *)local_d0;
LAB_00368e64:
    binary_op_broadcast<ncnn::binary_op_sub>(pMVar22,pMVar21,pMVar10,opt_00);
    break;
  case 8:
    pMVar21 = &local_118;
    pMVar22 = (Mat *)local_d0;
LAB_00368f48:
    binary_op_broadcast<ncnn::binary_op_div>(pMVar21,pMVar22,pMVar10,opt_00);
    break;
  case 9:
    pMVar22 = &local_118;
    pMVar21 = (Mat *)local_d0;
LAB_00368f1a:
    binary_op_broadcast<ncnn::binary_op_pow>(pMVar22,pMVar21,pMVar10,opt_00);
    break;
  case 10:
    pMVar22 = (Mat *)local_d0;
    pMVar21 = &local_118;
    goto LAB_00368f31;
  case 0xb:
    pMVar22 = &local_118;
    pMVar21 = (Mat *)local_d0;
LAB_00368f31:
    binary_op_broadcast<ncnn::binary_op_atan2>(pMVar22,pMVar21,pMVar10,opt_00);
    break;
  default:
    goto switchD_00368c3c_default;
  }
  iVar13 = 0;
switchD_00368c3c_default:
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if (*local_118.refcount == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((int *)local_d0._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_d0._8_8_ = *(int *)local_d0._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_d0._8_8_ == 0) {
      if ((Allocator *)local_d0._32_8_ == (Allocator *)0x0) {
        free((void *)local_d0._0_8_);
      }
      else {
        (*(*(_func_int ***)local_d0._32_8_)[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w == B.h)
                A2 = A.reshape(1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1);
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w == B.c)
                A2 = A.reshape(1, 1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1, 1);
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w == B.c)
                A2 = A.reshape(1, 1, 1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1, 1, 1);
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w == A.h)
                B2 = B.reshape(1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1);
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w == A.c)
                B2 = B.reshape(1, 1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1, 1);
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w == A.c)
                B2 = B.reshape(1, 1, 1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1, 1, 1);
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, 4u, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, 4u, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, 4u, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    binary_op_broadcast(A2, B2, top_blob, op_type, opt);

    return 0;
}